

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O1

int32_t borg_power_dynamic(void)

{
  byte bVar1;
  undefined8 *puVar2;
  char *pcVar3;
  int *piVar4;
  _Bool _Var5;
  int16_t iVar6;
  int16_t iVar7;
  int16_t iVar8;
  int16_t iVar9;
  int16_t iVar10;
  int16_t iVar11;
  ushort uVar12;
  int iVar13;
  int32_t iVar14;
  int iVar15;
  wchar_t wVar16;
  uint uVar17;
  ulong uVar18;
  borg_magic *pbVar19;
  int iVar20;
  int iVar21;
  borg_item_conflict *pbVar22;
  int iVar23;
  int book;
  int iVar24;
  long lVar25;
  bool bVar26;
  
  if (borg_formulas.power.count < 1) {
    iVar21 = 0;
  }
  else {
    lVar25 = 0;
    iVar21 = 0;
    do {
      puVar2 = (undefined8 *)borg_formulas.power.items[lVar25];
      pcVar3 = (char *)puVar2[3];
      if (pcVar3 == (char *)0x0) {
LAB_00222e17:
        piVar4 = (int *)*puVar2;
        if (piVar4 == (int *)0x0) {
          iVar13 = *(int *)((char *)puVar2[1] + 4);
          if (*(char *)puVar2[1] == '\x01') {
            iVar13 = borg_calculate_dynamic(iVar13,0);
          }
        }
        else {
          iVar13 = 0;
          iVar14 = calculate_from_value((value_sec *)puVar2[2],0);
          iVar20 = piVar4[1];
          if (iVar14 < piVar4[1]) {
            iVar20 = iVar14;
          }
          if (*piVar4 <= iVar20) {
            iVar24 = *piVar4 + -1;
            iVar13 = 0;
            do {
              iVar15 = *(int *)((char *)puVar2[1] + 4);
              if (*(char *)puVar2[1] == '\x01') {
                iVar15 = borg_calculate_dynamic(iVar15,iVar24);
              }
              iVar13 = iVar13 + iVar15;
              iVar24 = iVar24 + 1;
            } while (iVar20 != iVar24);
          }
        }
      }
      else {
        iVar13 = *(int *)(pcVar3 + 4);
        if (*pcVar3 == '\x01') {
          iVar13 = borg_calculate_dynamic(iVar13,0);
        }
        if (iVar13 != 0) goto LAB_00222e17;
        iVar13 = 0;
      }
      iVar21 = iVar21 + iVar13;
      lVar25 = lVar25 + 1;
    } while (lVar25 < borg_formulas.power.count);
  }
  wVar16 = borg_spell_stat();
  if (L'\0' < wVar16) {
    iVar6 = spell_chance(L'\0');
    iVar21 = (100 - iVar6) * 100 + iVar21;
  }
  _Var5 = flag_has_dbg((player->state).pflags,3,4,"player->state.pflags","(PF_ZERO_FAIL)");
  iVar13 = iVar21;
  if (_Var5) {
    iVar6 = spell_chance(L'\0');
    iVar13 = iVar21 + 30000;
    if (0 < iVar6) {
      iVar13 = iVar21;
    }
  }
  pbVar22 = borg_items;
  uVar18 = (ulong)z_info->pack_size;
  iVar21 = iVar13;
  if (((borg_items[uVar18 + 7].iqty != '\0') &&
      (_Var5 = borg_ego_has_random_power(e_info + borg_items[uVar18 + 7].ego_idx), _Var5)) &&
     (iVar21 = iVar13 + 999999, pbVar22[uVar18 + 7].ident != false)) {
    iVar21 = iVar13;
  }
  if (borg.trait[0xf] < 0xf) {
    iVar6 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 6);
    if (200 < iVar6) {
      iVar6 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 6);
      iVar21 = iVar21 + iVar6 * -0xf + 3000;
    }
    iVar6 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 9);
    iVar13 = iVar21 + -0xfa;
    if (iVar6 < 0x1f) {
      iVar13 = iVar21;
    }
    iVar6 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 8);
    iVar20 = iVar13 + -0xfa;
    if (iVar6 < 0xb) {
      iVar20 = iVar13;
    }
    iVar6 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 0xb);
    iVar21 = iVar20 + -0xfa;
    if (iVar6 < 0x33) {
      iVar21 = iVar20;
    }
  }
  iVar6 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 6);
  iVar7 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 9);
  iVar8 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 8);
  iVar9 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 7);
  iVar10 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 10);
  iVar11 = borg_item_weight(borg_items + (ulong)z_info->pack_size + 0xb);
  wVar16 = (player->class->magic).spell_weight;
  _Var5 = borg_can_cast();
  if ((_Var5) &&
     (uVar17 = ((int)iVar11 + (int)iVar10 + (int)iVar9 + (int)iVar8 + (int)iVar7 + (int)iVar6) -
               wVar16, 9 < (int)uVar17)) {
    iVar20 = borg.trait[0x20] / 100 - uVar17 / 10;
    iVar24 = 0;
    iVar13 = (uVar17 / 10) * -400;
    if (0x32 < iVar20 - 299U) {
      iVar13 = iVar24;
    }
    uVar17 = uVar17 / 10;
    iVar15 = uVar17 * -800;
    if (99 < iVar20 - 199U) {
      iVar15 = iVar24;
    }
    iVar23 = uVar17 * -0x640;
    if (99 < iVar20 - 99U) {
      iVar23 = iVar24;
    }
    iVar24 = uVar17 * -0xc80;
    if (0x62 < iVar20) {
      iVar24 = 0;
    }
    iVar21 = iVar15 + iVar13 + iVar24 + iVar21 + iVar23;
  }
  iVar13 = iVar21;
  if (((borg.trait[0x6a] - 0x19U < 0x10) && (borg.trait[0x2d] < 100000)) &&
     ((borg_items[z_info->pack_size].tval != '\x06' &&
      (iVar13 = iVar21 + 5000, borg.trait[0xff] != 1)))) {
    iVar13 = iVar21;
  }
  lVar25 = 0;
  do {
    if (borg.amt_book[lVar25] != 0) {
      if ((player->class->magic).books[lVar25].dungeon == false) {
        uVar17 = 99;
        wVar16 = L'\0';
        do {
          pbVar19 = borg_get_spell_entry((wchar_t)lVar25,wVar16);
          if ((pbVar19 != (borg_magic *)0x0) && (pbVar19->level <= uVar17)) {
            uVar17 = (uint)pbVar19->level;
          }
        } while ((pbVar19 != (borg_magic *)0x0) &&
                (bVar26 = (uint)wVar16 < 8, wVar16 = wVar16 + L'\x01', bVar26));
        if ((uVar17 < 6) || ((int)uVar17 < borg.trait[0x24] + 2)) {
          iVar21 = iVar13 + 500000;
          if (borg.amt_book[lVar25] < 1) {
            iVar21 = iVar13;
          }
          iVar13 = iVar21;
          if (5 < *borg.trait) {
            uVar12 = (ushort)(0 < borg.amt_book[lVar25]);
            do {
              if (borg.amt_book[lVar25] <= (short)uVar12) break;
              iVar13 = iVar13 + 10000;
              bVar26 = uVar12 == 0;
              uVar12 = 1;
            } while (bVar26);
          }
        }
      }
      else {
        wVar16 = L'\0';
        do {
          pbVar19 = borg_get_spell_entry((wchar_t)lVar25,wVar16);
          iVar21 = iVar13;
          if (((pbVar19 != (borg_magic *)0x0) && ((int)(uint)pbVar19->level <= borg.trait[0x24])) &&
             (iVar21 = iVar13 + 15000, borg.trait[0x1f] < (int)(uint)pbVar19->power)) {
            iVar21 = iVar13;
          }
          iVar13 = iVar21;
        } while ((pbVar19 != (borg_magic *)0x0) &&
                (bVar26 = (uint)wVar16 < 8, wVar16 = wVar16 + L'\x01', bVar26));
      }
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 9);
  iVar20 = borg.trait[0x105] / 2;
  iVar21 = borg.trait[0x104] - iVar20;
  if (iVar21 != 0 && iVar20 <= borg.trait[0x104]) {
    uVar17 = (uint)z_info->pack_size - borg.trait[0x9e];
    if ((int)uVar17 < 0) {
      pbVar22 = (borg_item_conflict *)0x0;
    }
    else {
      pbVar22 = (borg_item_conflict *)0x0;
      do {
        if (borg_items[uVar17].iqty != '\0') {
          pbVar22 = borg_items + uVar17;
          break;
        }
        bVar26 = 0 < (int)uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar26);
    }
    if (((pbVar22 != (borg_item_conflict *)0x0) && (pbVar22->iqty != '\0')) &&
       (pbVar22->aware == true)) {
      if (pbVar22->tval == '\x1a') {
        bVar1 = pbVar22->sval;
        if (sv_potion_inc_str == (uint)bVar1) {
          return iVar13;
        }
        if (sv_potion_inc_int == (uint)bVar1) {
          return iVar13;
        }
        wVar16 = (wchar_t)bVar1;
        if (sv_potion_inc_wis == wVar16) {
          return iVar13;
        }
        if (sv_potion_inc_dex == wVar16) {
          return iVar13;
        }
        if (sv_potion_inc_con == wVar16) {
          return iVar13;
        }
        if (sv_potion_inc_all == wVar16) {
          return iVar13;
        }
      }
      else if (pbVar22->tval == '\x19') {
        bVar1 = pbVar22->sval;
        if (((sv_scroll_enchant_armor == (uint)bVar1) && (borg.trait[0xed] < 1000)) &&
           (borg.trait[0xf0] != 0)) {
          return iVar13;
        }
        if (((sv_scroll_enchant_weapon_to_hit == (uint)bVar1) && (borg.trait[0xea] < 1000)) &&
           (borg.trait[0xf1] != 0)) {
          return iVar13;
        }
        wVar16 = (wchar_t)bVar1;
        if (((sv_scroll_enchant_weapon_to_dam == wVar16) && (borg.trait[0xeb] < 1000)) &&
           (borg.trait[0xf2] != 0)) {
          return iVar13;
        }
        if (sv_scroll_star_enchant_weapon == wVar16) {
          return iVar13;
        }
        if (sv_scroll_star_enchant_armor == wVar16) {
          return iVar13;
        }
      }
    }
    iVar13 = (iVar21 / (borg.trait[0x105] / 10)) * -1000 + iVar13;
  }
  return iVar13;
}

Assistant:

int32_t borg_power_dynamic(void)
{
    int     i;
    int32_t total = 0;

    /* MAX is used for "any" */
    for (i = 0; i < borg_formulas.power.count; i++) {
        total += calc_power(borg_formulas.power.items[i]);
    }

    /* HUGE HACK need some extra stuff that is hard to make dynamic*/
    if (borg_spell_stat() > 0)
        total += (100 - spell_chance(0)) * 100;

    /* should try to get min fail to 0 */
    if (player_has(player, PF_ZERO_FAIL)) {
        /* other fail rates */
        if (spell_chance(0) < 1)
            total += 30000L;
    }

    /*
     * Hack-- Reward the borg for carrying a NON-ID items that have random
     * powers
     */
    if (borg_items[INVEN_OUTER].iqty) {
        borg_item *item = &borg_items[INVEN_OUTER];
        if (((borg_ego_has_random_power(&e_info[item->ego_idx])
                && !item->ident)))
            total += 999999L;
    }

    /*** Penalize armor weight ***/
    if (borg.trait[BI_STR_INDEX] < 15) {
        if (borg_item_weight(&borg_items[INVEN_BODY]) > 200)
            total -= (borg_item_weight(&borg_items[INVEN_BODY]) - 200) * 15;
        if (borg_item_weight(&borg_items[INVEN_HEAD]) > 30)
            total -= 250;
        if (borg_item_weight(&borg_items[INVEN_ARM]) > 10)
            total -= 250;
        if (borg_item_weight(&borg_items[INVEN_FEET]) > 50)
            total -= 250;
    }

    /* Compute the total armor weight */
    int cur_wgt = 0;
    cur_wgt += borg_item_weight(&borg_items[INVEN_BODY]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_HEAD]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_ARM]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_OUTER]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_HANDS]);
    cur_wgt += borg_item_weight(&borg_items[INVEN_FEET]);

    /* Determine the weight allowance */
    int max_wgt = player->class->magic.spell_weight;

    /* Hack -- heavy armor hurts magic */
    if (borg_can_cast() && ((cur_wgt - max_wgt) / 10) > 0) {
        /* max sp must be calculated in case it changed with the armor */
        int max_sp = borg.trait[BI_SP_ADJ] / 100 + 1;
        max_sp -= ((cur_wgt - max_wgt) / 10);
        /* Mega-Hack -- Penalize heavy armor which hurts mana */
        if (max_sp >= 300 && max_sp <= 350)
            total -= (((cur_wgt - max_wgt) / 10) * 400L);
        if (max_sp >= 200 && max_sp <= 299)
            total -= (((cur_wgt - max_wgt) / 10) * 800L);
        if (max_sp >= 100 && max_sp <= 199)
            total -= (((cur_wgt - max_wgt) / 10) * 1600L);
        if (max_sp <= 99)
            total -= (((cur_wgt - max_wgt) / 10) * 3200L);
    }
    /* END MAJOR HACK */

    /* SECOND MAJOR HACK for inventory */

    /* Reward carrying a shovel if low level */
    if (borg.trait[BI_MAXDEPTH] <= 40 && borg.trait[BI_MAXDEPTH] >= 25
        && borg.trait[BI_GOLD] < 100000
        && borg_items[INVEN_WIELD].tval != TV_DIGGING
        && borg.trait[BI_ADIGGER] == 1)
        total += 5000L;

    /*** Hack -- books ***/
    /*   Reward books    */
    for (int book = 0; book < 9; book++) {
        /* No copies */
        if (!borg.amt_book[book])
            continue;

        /* The "hard" books */
        if (player->class->magic.books[book].dungeon) {
            int what;

            /* Scan the spells */
            for (what = 0; what < 9; what++) {
                borg_magic *as = borg_get_spell_entry(book, what);
                if (!as)
                    break;

                /* Track minimum level */
                if (as->level > borg.trait[BI_MAXCLEVEL])
                    continue;

                /* Track Mana req. */
                if (as->power > borg.trait[BI_MAXSP])
                    continue;

                /* Reward the book based on the spells I can cast */
                total += 15000L;
            }
        }

        /* The "easy" books */
        else {
            int what, when = 99;

            /* Scan the spells */
            for (what = 0; what < 9; what++) {
                borg_magic *as = borg_get_spell_entry(book, what);
                if (!as)
                    break;

                /* Track minimum level */
                if (as->level < when)
                    when = as->level;

                /* Track Mana req. */
                /* if (as->power < mana) mana = as->power; */
            }

            /* Hack -- Ignore "difficult" normal books */
            if ((when > 5) && (when >= borg.trait[BI_MAXCLEVEL] + 2))
                continue;
            /* if (mana > borg.trait[BI_MAXSP]) continue; */

            /* Reward the book */
            int k = 0;
            for (; k < 1 && k < borg.amt_book[book]; k++)
                total += 500000L;
            if (borg.trait[BI_STR] > 5)
                for (; k < 2 && k < borg.amt_book[book]; k++)
                    total += 10000L;
        }
    }

    /*  Hack -- Apply "encumbrance" from weight */

    /* XXX XXX XXX Apply "encumbrance" from weight */
    if (borg.trait[BI_WEIGHT] > borg.trait[BI_CARRY] / 2) {
        /* *HACK*  when testing items, the borg puts them in the last empty
         */
        /* slot so this is POSSIBLY just a test item */
        borg_item *item = NULL;
        for (i = PACK_SLOTS; i >= 0; i--) {
            if (borg_items[i].iqty) {
                item = &borg_items[i];
                break;
            }
        }

        /* Some items will be used immediately and should not contribute to
         * encumbrance */
        if (item && item->iqty && item->aware
            && ((item->tval == TV_SCROLL
                    && ((item->sval == sv_scroll_enchant_armor
                            && borg.trait[BI_AENCH_ARM] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_A])
                        || (item->sval == sv_scroll_enchant_weapon_to_hit
                            && borg.trait[BI_AENCH_TOH] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_H])
                        || (item->sval == sv_scroll_enchant_weapon_to_dam
                            && borg.trait[BI_AENCH_TOD] < 1000
                            && borg.trait[BI_NEED_ENCHANT_TO_D])
                        || item->sval == sv_scroll_star_enchant_weapon
                        || item->sval == sv_scroll_star_enchant_armor))
                || (item->tval == TV_POTION
                    && (item->sval == sv_potion_inc_str
                        || item->sval == sv_potion_inc_int
                        || item->sval == sv_potion_inc_wis
                        || item->sval == sv_potion_inc_dex
                        || item->sval == sv_potion_inc_con
                        || item->sval == sv_potion_inc_all)))) {
            /* No encumbrance penalty for purchasing these items */
        } else {
            total -= ((borg.trait[BI_WEIGHT] - (borg.trait[BI_CARRY] / 2))
                      / (borg.trait[BI_CARRY] / 10) * 1000L);
        }
    }
    /* END SECOND MAJOR HACK */

    return total;
}